

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

mat4 * mat4_look_at(mat4 *__return_storage_ptr__,vec3 position,vec3 target,vec3 up)

{
  mat4 m1;
  mat4 m2;
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  mat4 mat;
  mat4 T;
  undefined4 local_108;
  undefined4 local_48;
  undefined4 uStack_44;
  
  fVar6 = up.z;
  fVar3 = up.x;
  fVar4 = up.y;
  fVar2 = fVar6 * fVar6 + fVar3 * fVar3 + fVar4 * fVar4;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar11 = 0.0;
  fVar12 = 0.0;
  fVar13 = 0.0;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar12 = fVar3 / fVar2;
    fVar13 = fVar4 / fVar2;
    fVar11 = fVar6 / fVar2;
  }
  local_48 = position.x;
  uStack_44 = position.y;
  fVar3 = target.x - local_48;
  fVar4 = target.y - uStack_44;
  fVar6 = target.z - position.z;
  fVar2 = fVar6 * fVar6 + fVar3 * fVar3 + fVar4 * fVar4;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar7 = 0.0;
  fVar9 = 0.0;
  fVar10 = 0.0;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar9 = fVar3 / fVar2;
    fVar10 = fVar4 / fVar2;
    fVar7 = fVar6 / fVar2;
  }
  fVar4 = fVar10 * fVar11 - fVar7 * fVar13;
  fVar6 = fVar7 * fVar12 - fVar11 * fVar9;
  fVar3 = fVar13 * fVar9 - fVar12 * fVar10;
  fVar2 = fVar3 * fVar3 + fVar4 * fVar4 + fVar6 * fVar6;
  local_108 = -fVar10;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar12 = 0.0;
  fVar11 = 0.0;
  fVar13 = 0.0;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar11 = fVar4 / fVar2;
    fVar13 = fVar6 / fVar2;
    fVar12 = fVar3 / fVar2;
  }
  fVar4 = fVar13 * fVar7 + fVar12 * -fVar10;
  fVar6 = fVar12 * fVar9 - fVar7 * fVar11;
  fVar3 = fVar10 * fVar11 - fVar13 * fVar9;
  fVar2 = fVar3 * fVar3 + fVar4 * fVar4 + fVar6 * fVar6;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
    local_108 = -fVar10;
  }
  fVar8 = 0.0;
  fVar10 = 0.0;
  fVar5 = 0.0;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar10 = fVar4 / fVar2;
    fVar5 = fVar6 / fVar2;
    fVar8 = fVar3 / fVar2;
  }
  m2.m[0xb] = -position.z;
  m2.m[10] = 1.0;
  m1.m[1] = fVar13;
  m1.m[0] = fVar11;
  m1.m[5] = fVar5;
  m1.m[4] = fVar10;
  uVar1 = CONCAT44(local_108,fVar9) ^ 0x80000000;
  m1.m[2] = fVar12;
  m1.m[3] = 0.0;
  m1.m[6] = fVar8;
  m1.m[7] = 0.0;
  m1.m[8] = (float)(int)uVar1;
  m1.m[9] = (float)(int)(uVar1 >> 0x20);
  m1.m[10] = (float)(int)((ulong)(uint)fVar7 ^ 0x80000000);
  m1.m[0xb] = (float)(int)(((ulong)(uint)fVar7 ^ 0x80000000) >> 0x20);
  m1.m[0xc] = 0.0;
  m1.m[0xd] = 0.0;
  m1.m[0xe] = 0.0;
  m1.m[0xf] = 1.0;
  m2.m[2] = (float)(int)((ulong)(uint)-local_48 << 0x20);
  m2.m[3] = (float)(int)(((ulong)(uint)-local_48 << 0x20) >> 0x20);
  m2.m[0] = 1.0;
  m2.m[1] = 0.0;
  m2.m[4] = 0.0;
  m2.m[5] = 1.0;
  m2.m[6] = (float)(int)((ulong)(uint)-uStack_44 << 0x20);
  m2.m[7] = (float)(int)(((ulong)(uint)-uStack_44 << 0x20) >> 0x20);
  m2.m[8] = 0.0;
  m2.m[9] = 0.0;
  m2.m[0xc] = 0.0;
  m2.m[0xd] = 0.0;
  m2.m[0xe] = 0.0;
  m2.m[0xf] = 1.0;
  mat4_multiply(m1,m2);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_look_at(vec3 position, vec3 target, vec3 up) {
    vec3 up_p = vec3_normalize(up);
    vec3 f = vec3_normalize(vec3_subtract(target, position));
    vec3 s = vec3_normalize(vec3_cross(f, up_p));
    vec3 u = vec3_normalize(vec3_cross(s, f));

    mat4 M = mat4_create(
            s.x, s.y, s.z, 0.0,
            u.x, u.y, u.z, 0.0,
            -f.x, -f.y, -f.z, 0.0,
            0.0, 0.0, 0.0, 1.0);
    mat4 T = mat4_translation(vec3_scale(position, -1.0));

    return mat4_multiply(M, T);
}